

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void prvTidyReportNumWarnings(TidyDocImpl *doc)

{
  uint code;
  
  if ((doc->warnings == 0) && (doc->errors == 0)) {
    code = 0x21d;
  }
  else {
    code = 0x21e;
    if ((ulong)doc->errors <= (doc->config).value[0x49].v) {
      code = (uint)(*(int *)((doc->config).value + 0x4e) == 0) * 3 + 0x21b;
    }
  }
  prvTidyDialogue(doc,code);
  return;
}

Assistant:

void TY_(ReportNumWarnings)( TidyDocImpl* doc )
{
    if ( doc->warnings > 0 || doc->errors > 0 )
    {
        if ( doc->errors > cfg(doc, TidyShowErrors) || !cfgBool(doc, TidyShowWarnings) )
        {
            TY_(Dialogue)( doc, STRING_NOT_ALL_SHOWN );
        }
        else
        {
            TY_(Dialogue)( doc, STRING_ERROR_COUNT );
        }

    }
    else
    {
        TY_(Dialogue)( doc, STRING_NO_ERRORS );
    }
}